

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::scan_frames
          (QTextDocumentPrivate *this,int pos,int charsRemoved,int charsAdded)

{
  bool bVar1;
  QString *this_00;
  QTextFramePrivate *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QTextFrame *frame;
  QTextFrame *f;
  QChar ch;
  FragmentIterator it;
  QTextDocumentPrivate *in_stack_ffffffffffffff88;
  QTextDocumentPrivate *in_stack_ffffffffffffff90;
  QTextDocumentPrivate *in_stack_ffffffffffffff98;
  QTextDocumentPrivate *in_stack_ffffffffffffffa8;
  QTextDocumentPrivate *local_50;
  QChar local_30;
  QChar local_2e;
  QChar local_2c;
  char16_t local_2a;
  ConstIterator local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (QTextDocumentPrivate *)rootFrame(in_stack_ffffffffffffff98);
  clearFrame((QTextFrame *)in_stack_ffffffffffffff90);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  begin(in_stack_ffffffffffffff88);
  while( true ) {
    end(in_stack_ffffffffffffff88);
    bVar1 = QFragmentMap<QTextFragmentData>::ConstIterator::operator!=
                      ((ConstIterator *)local_18,&local_28);
    if (!bVar1) break;
    QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x7d5e8d);
    objectForFormat(in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffa8 =
         (QTextDocumentPrivate *)qobject_cast<QTextFrame*>((QObject *)0x7d5ea2);
    if (in_stack_ffffffffffffffa8 != (QTextDocumentPrivate *)0x0) {
      local_2a = 0xaaaa;
      this_00 = (QString *)(in_RDI + 0x80);
      QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x7d5eda);
      local_2a = (char16_t)QString::at(this_00,(qsizetype)in_stack_ffffffffffffff90);
      QChar::QChar<char16_t,_true>(&local_2c,L'﷐');
      bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff90,(QChar *)in_stack_ffffffffffffff88);
      if (bVar1) {
        if (local_50 != in_stack_ffffffffffffffa8) {
          pQVar2 = QTextFrame::d_func((QTextFrame *)0x7d5f31);
          pQVar2->parentFrame = (QTextFrame *)local_50;
          QTextFrame::d_func((QTextFrame *)0x7d5f47);
          QList<QTextFrame_*>::append
                    ((QList<QTextFrame_*> *)0x7d5f5b,(parameter_type)in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff90 = local_50;
          local_50 = in_stack_ffffffffffffffa8;
        }
      }
      else {
        QChar::QChar<char16_t,_true>(&local_2e,L'﷑');
        bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff90,(QChar *)in_stack_ffffffffffffff88);
        if (bVar1) {
          pQVar2 = QTextFrame::d_func((QTextFrame *)0x7d5f98);
          local_50 = (QTextDocumentPrivate *)pQVar2->parentFrame;
        }
        else {
          QChar::QChar<QChar::SpecialCharacter,_true>(&local_30,ObjectReplacementCharacter);
          bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff90,(QChar *)in_stack_ffffffffffffff88
                              );
          if (bVar1) {
            in_stack_ffffffffffffff88 = local_50;
            pQVar2 = QTextFrame::d_func((QTextFrame *)0x7d5fdd);
            pQVar2->parentFrame = (QTextFrame *)in_stack_ffffffffffffff88;
            QTextFrame::d_func((QTextFrame *)0x7d5ff2);
            QList<QTextFrame_*>::append
                      ((QList<QTextFrame_*> *)0x7d6006,(parameter_type)in_stack_ffffffffffffff88);
          }
        }
      }
    }
    QFragmentMap<QTextFragmentData>::ConstIterator::operator++
              ((ConstIterator *)in_stack_ffffffffffffff90);
  }
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::scan_frames(int pos, int charsRemoved, int charsAdded)
{
    // ###### optimize
    Q_UNUSED(pos);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);

    QTextFrame *f = rootFrame();
    clearFrame(f);

    for (FragmentIterator it = begin(); it != end(); ++it) {
        // QTextFormat fmt = formats.format(it->format);
        QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(it->format));
        if (!frame)
            continue;

        Q_ASSERT(it.size() == 1);
        QChar ch = text.at(it->stringPosition);

        if (ch == QTextBeginningOfFrame) {
            if (f != frame) {
                // f == frame happens for tables
                Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
                frame->d_func()->parentFrame = f;
                f->d_func()->childFrames.append(frame);
                f = frame;
            }
        } else if (ch == QTextEndOfFrame) {
            Q_ASSERT(f == frame);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            f = frame->d_func()->parentFrame;
        } else if (ch == QChar::ObjectReplacementCharacter) {
            Q_ASSERT(f != frame);
            Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            frame->d_func()->parentFrame = f;
            f->d_func()->childFrames.append(frame);
        } else {
            Q_ASSERT(false);
        }
    }
    Q_ASSERT(f == rtFrame);
    framesDirty = false;
}